

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O0

bool __thiscall
CompareTxMemPoolEntryByAncestorFee::operator()
          (CompareTxMemPoolEntryByAncestorFee *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  long lVar1;
  Txid *this_00;
  CompareTxMemPoolEntryByAncestorFee *in_RDX;
  double *in_RDI;
  long in_FS_OFFSET;
  double dVar2;
  double dVar3;
  double f2;
  double f1;
  double b_size;
  double b_mod_fee;
  double a_size;
  double a_mod_fee;
  CTxMemPoolEntry *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  double *in_stack_ffffffffffffffa8;
  CTxMemPoolEntry *in_stack_ffffffffffffffb0;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetModFeeAndSize<CTxMemPoolEntry>
            (in_RDX,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
  GetModFeeAndSize<CTxMemPoolEntry>
            (in_RDX,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
  dVar2 = local_10 * local_28;
  dVar3 = local_18 * local_20;
  if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
    local_29 = dVar3 < dVar2;
  }
  else {
    CTxMemPoolEntry::GetTx(in_stack_ffffffffffffff88);
    this_00 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffff88);
    CTxMemPoolEntry::GetTx(in_stack_ffffffffffffff88);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffff88);
    local_29 = transaction_identifier<false>::operator<
                         (this_00,(transaction_identifier<false> *)
                                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const T& a, const T& b) const
    {
        double a_mod_fee, a_size, b_mod_fee, b_size;

        GetModFeeAndSize(a, a_mod_fee, a_size);
        GetModFeeAndSize(b, b_mod_fee, b_size);

        // Avoid division by rewriting (a/b > c/d) as (a*d > c*b).
        double f1 = a_mod_fee * b_size;
        double f2 = a_size * b_mod_fee;

        if (f1 == f2) {
            return a.GetTx().GetHash() < b.GetTx().GetHash();
        }
        return f1 > f2;
    }